

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  byte bVar1;
  ulong uVar2;
  element_type *peVar3;
  long in_RSI;
  string className;
  SectionNode *rootSection;
  TestCaseStats *stats;
  undefined1 in_stack_00000297;
  SectionNode *in_stack_00000298;
  string *in_stack_000002a0;
  string *in_stack_000002a8;
  JunitReporter *in_stack_000002b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  allocator<char> local_111;
  string local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  element_type *local_20;
  long local_18;
  
  local_18 = in_RSI + 8;
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::front((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
           *)in_stack_fffffffffffffed0);
  local_20 = clara::std::
             __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_fffffffffffffed0);
  std::__cxx11::string::string(local_40,(string *)(local_18 + 0x28));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    anon_unknown_1::fileNameTag(in_stack_fffffffffffffef8);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::operator=(local_40,"global");
    }
  }
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13e900);
  (*(peVar3->super_NonCopyable)._vptr_NonCopyable[4])(local_90);
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_90);
  if ((bVar1 & 1) != 0) {
    peVar3 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13e951);
    (*(peVar3->super_NonCopyable)._vptr_NonCopyable[4])(&stack0xffffffffffffff10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffed8),(char *)in_stack_fffffffffffffed0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_fffffffffffffed8),in_stack_fffffffffffffed0);
    std::__cxx11::string::operator=(local_40,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  TestCaseInfo::okToFail((TestCaseInfo *)(local_18 + 8));
  writeSection(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
               (bool)in_stack_00000297);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void JunitReporter::writeTestCase( TestCaseNode const& testCaseNode ) {
        TestCaseStats const& stats = testCaseNode.value;

        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert( testCaseNode.children.size() == 1 );
        SectionNode const& rootSection = *testCaseNode.children.front();

        std::string className = stats.testInfo.className;

        if( className.empty() ) {
            className = fileNameTag(stats.testInfo.tags);
            if ( className.empty() )
                className = "global";
        }

        if ( !m_config->name().empty() )
            className = m_config->name() + "." + className;

        writeSection( className, "", rootSection, stats.testInfo.okToFail() );
    }